

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecExpand(Vec_Vec_t *p,int Level)

{
  void *pvVar1;
  long lVar2;
  
  if (p->nSize <= Level) {
    Vec_PtrGrow((Vec_Ptr_t *)p,Level + 1);
    for (lVar2 = (long)p->nSize; lVar2 <= Level; lVar2 = lVar2 + 1) {
      pvVar1 = calloc(1,0x10);
      p->pArray[lVar2] = pvVar1;
    }
    p->nSize = Level + 1;
  }
  return;
}

Assistant:

static inline void Vec_VecExpand( Vec_Vec_t * p, int Level )
{
    int i;
    if ( p->nSize >= Level + 1 )
        return;
    Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
    for ( i = p->nSize; i <= Level; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = Level + 1;
}